

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentFactoredStates::StateIndexToFactorValueIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MADPComponentFactoredStates *this,Index s_e,Scope *sfSC)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_sf_e;
  allocator_type local_41;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(sfSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_41);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (&this->_m_sfacDomainSizes,sfSC,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  IndexTools::JointToIndividualIndices
            (__return_storage_ptr__,s_e,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

vector<Index> MADPComponentFactoredStates::
StateIndexToFactorValueIndices(Index s_e, 
        const Scope& sfSC) const
{
    vector<size_t> nr_sf_e(sfSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        _m_sfacDomainSizes, sfSC, nr_sf_e);
    vector<Index> s_e_vec = IndexTools::JointToIndividualIndices(s_e, nr_sf_e);
    return(s_e_vec);
}